

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O3

void Imath_2_5::minEigenVector<Imath_2_5::Matrix44<float>,Imath_2_5::Vec4<float>>
               (Matrix44<float> *A,Vec4<float> *V)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  uint i;
  long lVar5;
  int iVar6;
  Vec4<float> S;
  Matrix44<float> MV;
  Vec4<float> local_58;
  Matrix44<float> local_48;
  
  local_48.x[1][3] = 0.0;
  local_48.x[2][0] = 0.0;
  local_48.x[2][3] = 0.0;
  local_48.x[3][0] = 0.0;
  local_48.x[0][1] = 0.0;
  local_48.x[0][2] = 0.0;
  local_48.x[0][3] = 0.0;
  local_48.x[1][0] = 0.0;
  local_48.x[3][1] = 0.0;
  local_48.x[3][2] = 0.0;
  local_48.x[0][0] = 1.0;
  local_48.x[1][1] = 1.0;
  local_48.x[1][2] = 0.0;
  local_48.x[2][1] = 0.0;
  local_48.x[2][2] = 1.0;
  local_48.x[3][3] = 1.0;
  jacobiEigenSolver<float>(A,&local_58,&local_48,1.1920929e-07);
  iVar6 = 0;
  lVar5 = 1;
  do {
    iVar4 = (int)lVar5;
    if (ABS((&local_58.x)[iVar6]) <= ABS((&local_58.x)[lVar5])) {
      iVar4 = iVar6;
    }
    iVar6 = iVar4;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  fVar1 = local_48.x[1][iVar6];
  fVar2 = local_48.x[2][iVar6];
  fVar3 = local_48.x[3][iVar6];
  V->x = local_48.x[0][iVar6];
  V->y = fVar1;
  V->z = fVar2;
  V->w = fVar3;
  return;
}

Assistant:

void
minEigenVector (TM& A, TV& V)
{
    TV S;
    TM MV;
    jacobiEigenSolver(A, S, MV);

    int minIdx(0);
    for(unsigned int i = 1; i < TV::dimensions(); ++i)
    {
        if(std::abs(S[i]) < std::abs(S[minIdx]))
            minIdx = i;
    }

   for(unsigned int i = 0; i < TV::dimensions(); ++i)
        V[i] = MV[i][minIdx];
}